

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O3

bool __thiscall Opcode::AABBQuantizedNoLeafTree::Build(AABBQuantizedNoLeafTree *this,AABBTree *tree)

{
  AABBNoLeafNode *linear;
  undefined8 *puVar1;
  AABBNoLeafNode *pAVar2;
  AABBQuantizedNoLeafNode *pAVar3;
  sword *psVar4;
  ulong *puVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  AABBQuantizedNoLeafNode *pAVar11;
  bool bVar12;
  ulong *puVar13;
  ulong *puVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  udword j;
  uword *puVar18;
  uword uVar19;
  udword uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [16];
  ulong uVar27;
  undefined1 auVar28 [16];
  float fVar29;
  udword CurID;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  udword local_34;
  
  if (tree == (AABBTree *)0x0) {
    return false;
  }
  uVar20 = (tree->super_AABBTreeNode).mNbPrimitives;
  if (tree->mTotalNbNodes == uVar20 * 2 - 1) {
    uVar20 = uVar20 - 1;
    (this->super_AABBOptimizedTree).mNbNodes = uVar20;
    pAVar11 = this->mNodes;
    if (pAVar11 != (AABBQuantizedNoLeafNode *)0x0) {
      operator_delete__(&pAVar11[-1].mNegData,pAVar11[-1].mNegData << 5 | 8);
      this->mNodes = (AABBQuantizedNoLeafNode *)0x0;
      uVar20 = (this->super_AABBOptimizedTree).mNbNodes;
    }
    uVar17 = (ulong)uVar20;
    puVar13 = (ulong *)operator_new__(uVar17 * 0x28 + 8);
    *puVar13 = uVar17;
    linear = (AABBNoLeafNode *)(puVar13 + 1);
    if (uVar20 != 0) {
      lVar16 = 0;
      do {
        puVar1 = (undefined8 *)((long)puVar13 + lVar16 + 0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar16 = lVar16 + 0x28;
      } while (uVar17 * 0x28 != lVar16);
    }
    local_34 = 1;
    _BuildNoLeafTree(linear,0,&local_34,&tree->super_AABBTreeNode);
    uVar17 = (ulong)(this->super_AABBOptimizedTree).mNbNodes;
    puVar14 = (ulong *)operator_new__(uVar17 * 0x20 + 8);
    pAVar11 = (AABBQuantizedNoLeafNode *)(puVar14 + 1);
    *puVar14 = uVar17;
    if (uVar17 == 0) {
      this->mNodes = pAVar11;
      auVar21 = _DAT_001f6f00;
      auVar24 = _DAT_001e8300;
    }
    else {
      lVar16 = 0;
      do {
        puVar1 = (undefined8 *)((long)puVar14 + lVar16 + 0x18);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar16 = lVar16 + 0x20;
      } while (uVar17 * 0x20 != lVar16);
      this->mNodes = pAVar11;
      auVar21 = _DAT_001f6f00;
      auVar24 = _DAT_001e8300;
      if (uVar17 != 0) {
        lVar16 = 0;
        do {
          puVar5 = (ulong *)((long)puVar13 + lVar16 + 8);
          auVar26._0_8_ = *puVar5 & 0x7fffffff7fffffff;
          auVar26._8_4_ = (uint)puVar5[1] & 0x7fffffff;
          auVar26._12_4_ = *(uint *)((long)puVar5 + 0xc) & 0x7fffffff;
          auVar21 = maxps(auVar26,auVar21);
          auVar23._0_8_ = *(ulong *)((long)puVar13 + lVar16 + 0x18) & 0x7fffffff7fffffff;
          auVar23._8_8_ = 0;
          auVar24 = maxps(auVar23,auVar24);
          lVar16 = lVar16 + 0x28;
        } while (uVar17 * 0x28 != lVar16);
      }
    }
    auVar26 = divps(_DAT_001f6f10,auVar21);
    auVar22._0_4_ = (float)(-(uint)(auVar21._0_4_ != 0.0) & auVar26._0_4_);
    auVar22._4_4_ = (float)(-(uint)(auVar21._4_4_ != 0.0) & auVar26._4_4_);
    auVar22._8_4_ = (float)(-(uint)(auVar21._8_4_ != 0.0) & auVar26._8_4_);
    auVar22._12_4_ = (float)(-(uint)(auVar21._12_4_ != 0.0) & auVar26._12_4_);
    auVar26 = divps(_DAT_001f6f20,auVar24);
    auVar21._0_4_ = (float)(-(uint)(auVar24._0_4_ != 0.0) & auVar26._0_4_);
    auVar21._4_4_ = (float)(-(uint)(auVar24._4_4_ != 0.0) & auVar26._4_4_);
    auVar21._8_4_ = (float)(-(uint)(auVar24._8_4_ != 0.0) & auVar26._8_4_);
    auVar21._12_4_ = (float)(-(uint)(auVar24._12_4_ != 0.0) & auVar26._12_4_);
    auVar24 = divps(_DAT_001f3c90,auVar22);
    (this->mCenterCoeff).x = (float)(auVar24._0_4_ & -(uint)(auVar22._0_4_ != 0.0));
    (this->mCenterCoeff).y = (float)(auVar24._4_4_ & -(uint)(auVar22._4_4_ != 0.0));
    (this->mCenterCoeff).z = (float)(auVar24._8_4_ & -(uint)(auVar22._8_4_ != 0.0));
    (this->mExtentsCoeff).x = (float)(auVar24._12_4_ & -(uint)(auVar22._12_4_ != 0.0));
    auVar24 = divps(_DAT_001eaa50,auVar21);
    (this->mExtentsCoeff).y = (float)(auVar24._0_4_ & -(uint)(auVar21._0_4_ != 0.0));
    (this->mExtentsCoeff).z = (float)(auVar24._4_4_ & -(uint)(auVar21._4_4_ != 0.0));
    if (uVar17 != 0) {
      uVar15 = 0;
      do {
        pAVar2 = linear + uVar15;
        fVar7 = (pAVar2->mAABB).mCenter.x;
        fVar8 = (pAVar2->mAABB).mCenter.y;
        fVar25 = (pAVar2->mAABB).mCenter.z;
        fVar29 = (pAVar2->mAABB).mExtents.x;
        auVar24._0_4_ = (int)(auVar22._0_4_ * fVar7);
        auVar24._4_4_ = (int)(auVar22._4_4_ * fVar8);
        auVar24._8_4_ = (int)(auVar22._8_4_ * fVar25);
        auVar24._12_4_ = (int)(auVar22._12_4_ * fVar29);
        auVar26 = packssdw(auVar24,auVar24);
        uVar27 = auVar26._0_8_ & 0xffffffffffff | auVar24._6_8_ & 0xffff000000000000;
        pAVar3 = pAVar11 + uVar15;
        (pAVar3->mAABB).mCenter[0] = (short)uVar27;
        (pAVar3->mAABB).mCenter[1] = (short)(uVar27 >> 0x10);
        (pAVar3->mAABB).mCenter[2] = (short)(uVar27 >> 0x20);
        (pAVar3->mAABB).mExtents[0] = (short)(uVar27 >> 0x30);
        uVar9 = (pAVar2->mAABB).mExtents.y;
        uVar10 = (pAVar2->mAABB).mExtents.z;
        auVar28._0_4_ = (int)(auVar21._0_4_ * (float)uVar9);
        auVar28._4_4_ = (int)(auVar21._4_4_ * (float)uVar10);
        auVar28._8_4_ = (int)(auVar21._8_4_ * 0.0);
        auVar28._12_4_ = (int)(auVar21._12_4_ * 0.0);
        auVar24 = pshuflw(auVar28,auVar28,0xe8);
        *(int *)(puVar14 + uVar15 * 4 + 2) = auVar24._0_4_;
        local_40 = CONCAT44(fVar8 + (float)uVar9,fVar7 + fVar29);
        local_38 = fVar25 + (float)uVar10;
        local_50 = CONCAT44(fVar8 - (float)uVar9,fVar7 - fVar29);
        local_48 = fVar25 - (float)uVar10;
        lVar16 = 0;
        do {
          psVar4 = pAVar11[uVar15].mAABB.mCenter + lVar16;
          puVar18 = (uword *)(psVar4 + 3);
          fVar25 = (float)(int)*psVar4 * (&(this->mCenterCoeff).x)[lVar16];
          fVar7 = (&(this->mExtentsCoeff).x)[lVar16];
          fVar8 = *(float *)((long)&local_40 + lVar16 * 4);
          uVar19 = *puVar18;
          do {
            fVar29 = (float)uVar19 * fVar7;
            if ((fVar8 <= fVar25 + fVar29) &&
               (fVar29 = fVar25 - fVar29, pfVar6 = (float *)((long)&local_50 + lVar16 * 4),
               fVar29 < *pfVar6 || fVar29 == *pfVar6)) {
              if (uVar19 != 0) goto LAB_001acf34;
              break;
            }
            uVar19 = uVar19 + 1;
            *puVar18 = uVar19;
          } while (uVar19 != 0);
          *puVar18 = 0xffff;
LAB_001acf34:
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
        uVar27 = pAVar2->mPosData;
        if ((uVar27 & 1) == 0) {
          uVar27 = (long)(pAVar11->mAABB).mCenter +
                   (ulong)((uint)((ulong)(uint)((int)uVar27 - (int)linear) * 0xcccccccd >> 0x20) &
                          0xffffffe0);
        }
        puVar14[uVar15 * 4 + 3] = uVar27;
        uVar27 = pAVar2->mNegData;
        if ((uVar27 & 1) == 0) {
          uVar27 = (long)(pAVar11->mAABB).mCenter +
                   (ulong)((uint)((ulong)(uint)((int)uVar27 - (int)linear) * 0xcccccccd >> 0x20) &
                          0xffffffe0);
        }
        puVar14[uVar15 * 4 + 4] = uVar27;
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar17);
    }
    operator_delete__(puVar13,*puVar13 * 0x28 + 8);
    bVar12 = true;
  }
  else {
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool AABBQuantizedNoLeafTree::Build(AABBTree* tree)
{
	// Checkings
	if(!tree)	return false;
	// Check the input tree is complete
	udword NbTriangles	= tree->GetNbPrimitives();
	udword NbNodes		= tree->GetNbNodes();
	if(NbNodes!=NbTriangles*2-1)	return false;

	// Get nodes
	mNbNodes = NbTriangles-1;
	DELETEARRAY(mNodes);
	AABBNoLeafNode* Nodes = new AABBNoLeafNode[mNbNodes];
	CHECKALLOC(Nodes);

	// Build the tree
	udword CurID = 1;
	_BuildNoLeafTree(Nodes, 0, CurID, tree);
	ASSERT(CurID==mNbNodes);

	// Quantize
	{
		mNodes = new AABBQuantizedNoLeafNode[mNbNodes];
		CHECKALLOC(mNodes);

		// Get max values
		FIND_MAX_VALUES

		// Quantization
		INIT_QUANTIZATION

		// Quantize
		uintptr_t Data;
		for(udword i=0;i<mNbNodes;i++)
		{
			PERFORM_QUANTIZATION
			REMAP_DATA(mPosData)
			REMAP_DATA(mNegData)
		}

		DELETEARRAY(Nodes);
	}

	return true;
}